

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int binchrr(bstring b0,int pos,bstring b1)

{
  int iVar1;
  uchar *data;
  int iVar2;
  int iVar3;
  charField chrs;
  
  iVar3 = -1;
  if (((b0 != (bstring)0x0 && -1 < pos) && (data = b0->data, data != (uchar *)0x0)) &&
     (iVar1 = b0->slen, pos <= iVar1)) {
    iVar2 = buildCharField(&chrs,b1);
    if (-1 < iVar2) {
      iVar3 = binchrrCF(data,pos - (uint)(iVar1 == pos),&chrs);
    }
  }
  return iVar3;
}

Assistant:

int binchrr (const bstring b0, int pos, const bstring b1) {
struct charField chrs;
	if (pos < 0 || b0 == NULL || b0->data == NULL ||
	    b0->slen < pos) return BSTR_ERR;
	if (pos == b0->slen) pos--;
	if (buildCharField (&chrs, b1) < 0) return BSTR_ERR;
	return binchrrCF (b0->data, pos, &chrs);
}